

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void cmGlobalNinjaGenerator::WriteRule
               (ostream *os,string *name,string *command,string *description,string *comment,
               string *depfile,string *deptype,string *rspfile,string *rspcontent,string *restat,
               bool generator)

{
  ulong uVar1;
  ostream *poVar2;
  char *pcVar3;
  bool generator_local;
  string *depfile_local;
  string *comment_local;
  string *description_local;
  string *command_local;
  string *name_local;
  ostream *os_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      WriteComment(os,comment);
      poVar2 = std::operator<<(os,"rule ");
      poVar2 = std::operator<<(poVar2,(string *)name);
      std::operator<<(poVar2,"\n");
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        Indent(os,1);
        poVar2 = std::operator<<(os,"depfile = ");
        poVar2 = std::operator<<(poVar2,(string *)depfile);
        std::operator<<(poVar2,"\n");
      }
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        Indent(os,1);
        poVar2 = std::operator<<(os,"deps = ");
        poVar2 = std::operator<<(poVar2,(string *)deptype);
        std::operator<<(poVar2,"\n");
      }
      Indent(os,1);
      poVar2 = std::operator<<(os,"command = ");
      poVar2 = std::operator<<(poVar2,(string *)command);
      std::operator<<(poVar2,"\n");
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        Indent(os,1);
        poVar2 = std::operator<<(os,"description = ");
        poVar2 = std::operator<<(poVar2,(string *)description);
        std::operator<<(poVar2,"\n");
      }
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        uVar1 = std::__cxx11::string::empty();
        if ((uVar1 & 1) != 0) {
          pcVar3 = (char *)std::__cxx11::string::c_str();
          cmSystemTools::Error("No rspfile_content given!",pcVar3,(char *)0x0,(char *)0x0);
          return;
        }
        Indent(os,1);
        poVar2 = std::operator<<(os,"rspfile = ");
        poVar2 = std::operator<<(poVar2,(string *)rspfile);
        std::operator<<(poVar2,"\n");
        Indent(os,1);
        poVar2 = std::operator<<(os,"rspfile_content = ");
        poVar2 = std::operator<<(poVar2,(string *)rspcontent);
        std::operator<<(poVar2,"\n");
      }
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        Indent(os,1);
        poVar2 = std::operator<<(os,"restat = ");
        poVar2 = std::operator<<(poVar2,(string *)restat);
        std::operator<<(poVar2,"\n");
      }
      if (generator) {
        Indent(os,1);
        std::operator<<(os,"generator = 1\n");
      }
      std::operator<<(os,"\n");
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error
                ("No command given for WriteRuleStatement! called with comment: ",pcVar3,(char *)0x0
                 ,(char *)0x0);
    }
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Error
              ("No name given for WriteRuleStatement! called with comment: ",pcVar3,(char *)0x0,
               (char *)0x0);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteRule(
  std::ostream& os, const std::string& name, const std::string& command,
  const std::string& description, const std::string& comment,
  const std::string& depfile, const std::string& deptype,
  const std::string& rspfile, const std::string& rspcontent,
  const std::string& restat, bool generator)
{
  // Make sure the rule has a name.
  if (name.empty()) {
    cmSystemTools::Error("No name given for WriteRuleStatement! called "
                         "with comment: ",
                         comment.c_str());
    return;
  }

  // Make sure a command is given.
  if (command.empty()) {
    cmSystemTools::Error("No command given for WriteRuleStatement! called "
                         "with comment: ",
                         comment.c_str());
    return;
  }

  cmGlobalNinjaGenerator::WriteComment(os, comment);

  // Write the rule.
  os << "rule " << name << "\n";

  // Write the depfile if any.
  if (!depfile.empty()) {
    cmGlobalNinjaGenerator::Indent(os, 1);
    os << "depfile = " << depfile << "\n";
  }

  // Write the deptype if any.
  if (!deptype.empty()) {
    cmGlobalNinjaGenerator::Indent(os, 1);
    os << "deps = " << deptype << "\n";
  }

  // Write the command.
  cmGlobalNinjaGenerator::Indent(os, 1);
  os << "command = " << command << "\n";

  // Write the description if any.
  if (!description.empty()) {
    cmGlobalNinjaGenerator::Indent(os, 1);
    os << "description = " << description << "\n";
  }

  if (!rspfile.empty()) {
    if (rspcontent.empty()) {
      cmSystemTools::Error("No rspfile_content given!", comment.c_str());
      return;
    }
    cmGlobalNinjaGenerator::Indent(os, 1);
    os << "rspfile = " << rspfile << "\n";
    cmGlobalNinjaGenerator::Indent(os, 1);
    os << "rspfile_content = " << rspcontent << "\n";
  }

  if (!restat.empty()) {
    cmGlobalNinjaGenerator::Indent(os, 1);
    os << "restat = " << restat << "\n";
  }

  if (generator) {
    cmGlobalNinjaGenerator::Indent(os, 1);
    os << "generator = 1\n";
  }

  os << "\n";
}